

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

void mpack_skip_bytes_straddle(mpack_reader_t *reader,size_t count)

{
  char *pcVar1;
  char *pcVar2;
  char *min_bytes;
  
  if (reader->fill == (mpack_reader_fill_t)0x0) {
    mpack_reader_flag_error(reader,mpack_error_invalid);
    return;
  }
  min_bytes = reader->data + (count - (long)reader->end);
  reader->data = reader->end;
  if (reader->skip != (mpack_reader_skip_t)0x0) {
    if ((char *)(reader->size >> 4) < min_bytes) {
      (*reader->skip)(reader,(size_t)min_bytes);
      return;
    }
    mpack_reader_skip_using_fill(reader,(size_t)min_bytes);
    return;
  }
  pcVar2 = (char *)reader->size;
  for (; pcVar1 = reader->buffer, pcVar2 < min_bytes; min_bytes = min_bytes + -(long)pcVar2) {
    pcVar1 = (char *)mpack_fill_range(reader,pcVar1,(size_t)pcVar2,(size_t)pcVar2);
    pcVar2 = (char *)reader->size;
    if (pcVar1 < pcVar2) goto LAB_0010853d;
  }
  reader->data = pcVar1;
  pcVar2 = (char *)mpack_fill_range(reader,pcVar1,(size_t)min_bytes,(size_t)pcVar2);
  if (min_bytes <= pcVar2) {
    reader->end = reader->data + (long)pcVar2;
    reader->data = reader->data + (long)min_bytes;
    return;
  }
LAB_0010853d:
  mpack_reader_flag_error(reader,mpack_error_io);
  return;
}

Assistant:

MPACK_NOINLINE static void mpack_skip_bytes_straddle(mpack_reader_t* reader, size_t count) {

    // we'll need at least a fill function to skip more data. if there's
    // no fill function, the buffer should contain an entire MessagePack
    // object, so we raise mpack_error_invalid instead of mpack_error_io
    // on truncated data. (see mpack_read_native_straddle())
    if (reader->fill == NULL) {
        mpack_log("reader has no fill function!\n");
        mpack_reader_flag_error(reader, mpack_error_invalid);
        return;
    }

    // discard whatever's left in the buffer
    size_t left = (size_t)(reader->end - reader->data);
    mpack_log("discarding %i bytes still in buffer\n", (int)left);
    count -= left;
    reader->data = reader->end;

    // use the skip function if we've got one, and if we're trying
    // to skip a lot of data. if we only need to skip some tiny
    // fraction of the buffer size, it's probably better to just
    // fill the buffer and skip from it instead of trying to seek.
    if (reader->skip && count > reader->size / 16) {
        mpack_log("calling skip function for %i bytes\n", (int)count);
        reader->skip(reader, count);
        return;
    }

    mpack_reader_skip_using_fill(reader, count);
}